

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser_test.cpp
# Opt level: O2

void TestParseCondition(void)

{
  element_type *peVar1;
  int iVar2;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  string local_1e8 [36];
  Date local_1c4;
  string local_1b8;
  shared_ptr<Node> root;
  istringstream is;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"date != 2017-11-18",(allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 1",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,0xb,0x12);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 2",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"event == \"sport event\"",(allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"sport event",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 3",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 4",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"date >= 2017-01-01 AND date < 2017-07-01",(allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 5",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,3,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 6",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,6,0x1e);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 7",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,7,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 8",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e0,0xc,0x1f);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 9",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"event != \"sport event\" AND event != \"Wednesday\"",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 10",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"sport event",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 11",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"Wednesday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 12",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"event == \"holiday AND date == 2017-11-18\"",(allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,0xb,0x12);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 13",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,0xb,0x12);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"work day",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 14",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,1,1,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"holiday AND date == 2017-11-18",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 15",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"((event == \"holiday\" AND date == 2017-01-01))",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 16",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 17",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"date > 2017-01-01 AND (event == \"holiday\" OR date < 2017-07-01)",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e0,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 18",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 19",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"workday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 20",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e2,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"workday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 21",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"date > 2017-01-01 AND event == \"holiday\" OR date < 2017-07-01",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e0,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"event",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 22",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 23",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"workday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 24",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e2,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"workday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 25",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"((date == 2017-01-01 AND event == \"holiday\"))",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 26",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e1,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"holiday",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 27",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"((event == \"2017-01-01\" OR date > 2016-01-01))",
             (allocator<char> *)&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,local_1e8,_S_in);
  std::__cxx11::string::~string(local_1e8);
  ParseCondition((istream *)&root);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,1,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"2017-01-01",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 28",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  peVar1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Date::Date(&local_1c4,0x7e0,1,1);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"event",&local_1e9);
  iVar2 = (**peVar1->_vptr_Node)(peVar1,&local_1c4,local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 29",&local_1ea);
  Assert((bool)((byte)iVar2 ^ 1),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  Date::Date(&local_1c4,0x7e0,1,2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"event",&local_1e9);
  iVar2 = (**(root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node)
                    (root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_1c4,
                     local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Parse condition 30",&local_1ea);
  Assert(SUB41(iVar2,0),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return;
}

Assistant:

void TestParseCondition() {
    {
        istringstream is("date != 2017-11-18");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, ""), "Parse condition 1");
        Assert(!root->Evaluate({2017, 11, 18}, ""), "Parse condition 2");
    }
    {
        istringstream is(R"(event == "sport event")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "sport event"), "Parse condition 3");
        Assert(!root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 4");
    }
    {
        istringstream is("date >= 2017-01-01 AND date < 2017-07-01");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, ""), "Parse condition 5");
        Assert(root->Evaluate({2017, 3, 1}, ""), "Parse condition 6");
        Assert(root->Evaluate({2017, 6, 30}, ""), "Parse condition 7");
        Assert(!root->Evaluate({2017, 7, 1}, ""), "Parse condition 8");
        Assert(!root->Evaluate({2016, 12, 31}, ""), "Parse condition 9");
    }
    {
        istringstream is(R"(event != "sport event" AND event != "Wednesday")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 10");
        Assert(!root->Evaluate({2017, 1, 1}, "sport event"), "Parse condition 11");
        Assert(!root->Evaluate({2017, 1, 1}, "Wednesday"), "Parse condition 12");
    }
    {
        istringstream is(R"(event == "holiday AND date == 2017-11-18")");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(!root->Evaluate({2017, 11, 18}, "holiday"), "Parse condition 13");
        Assert(!root->Evaluate({2017, 11, 18}, "work day"), "Parse condition 14");
        Assert(root->Evaluate({1, 1, 1}, "holiday AND date == 2017-11-18"), "Parse condition 15");
    }
    {
        istringstream is(R"(((event == "holiday" AND date == 2017-01-01)))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 16");
        Assert(!root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 17");
    }
    {
        istringstream is(R"(date > 2017-01-01 AND (event == "holiday" OR date < 2017-07-01))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(!root->Evaluate({2016, 1, 1}, "holiday"), "Parse condition 18");
        Assert(root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 19");
        Assert(root->Evaluate({2017, 1, 2}, "workday"), "Parse condition 20");
        Assert(!root->Evaluate({2018, 1, 2}, "workday"), "Parse condition 21");
    }
    {
        istringstream is(R"(date > 2017-01-01 AND event == "holiday" OR date < 2017-07-01)");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2016, 1, 1}, "event"), "Parse condition 22");
        Assert(root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 23");
        Assert(root->Evaluate({2017, 1, 2}, "workday"), "Parse condition 24");
        Assert(!root->Evaluate({2018, 1, 2}, "workday"), "Parse condition 25");
    }
    {
        istringstream is(R"(((date == 2017-01-01 AND event == "holiday")))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({2017, 1, 1}, "holiday"), "Parse condition 26");
        Assert(!root->Evaluate({2017, 1, 2}, "holiday"), "Parse condition 27");
    }
    {
        istringstream is(R"(((event == "2017-01-01" OR date > 2016-01-01)))");
        shared_ptr<Node> root = ParseCondition(is);
        Assert(root->Evaluate({1, 1, 1}, "2017-01-01"), "Parse condition 28");
        Assert(!root->Evaluate({2016, 1, 1}, "event"), "Parse condition 29");
        Assert(root->Evaluate({2016, 1, 2}, "event"), "Parse condition 30");
    }
}